

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O0

spvc_result
spvc_compiler_get_combined_image_samplers
          (spvc_compiler compiler,spvc_combined_image_sampler **samplers,size_t *num_samplers)

{
  spvc_context psVar1;
  pointer this;
  SmallVector<spirv_cross::CombinedImageSampler,_8UL> *other;
  size_t sVar2;
  CombinedImageSampler *pCVar3;
  pointer pTVar4;
  spvc_combined_image_sampler *psVar5;
  exception *e;
  unique_ptr<TemporaryBuffer<spvc_combined_image_sampler>,_std::default_delete<TemporaryBuffer<spvc_combined_image_sampler>_>_>
  local_160;
  unique_ptr<TemporaryBuffer<spvc_combined_image_sampler>,_std::default_delete<TemporaryBuffer<spvc_combined_image_sampler>_>_>
  ptr;
  spvc_combined_image_sampler trans;
  CombinedImageSampler *c;
  CombinedImageSampler *__end1;
  CombinedImageSampler *__begin1;
  SmallVector<spirv_cross::CombinedImageSampler,_8UL> *__range1;
  SmallVector<spvc_combined_image_sampler,_8UL> translated;
  undefined1 local_a0 [8];
  SmallVector<spirv_cross::CombinedImageSampler,_8UL> combined;
  size_t *num_samplers_local;
  spvc_combined_image_sampler **samplers_local;
  spvc_compiler compiler_local;
  
  combined.stack_storage.aligned_char._88_8_ = num_samplers;
  this = std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::
         operator->(&compiler->compiler);
  other = spirv_cross::Compiler::get_combined_image_samplers(this);
  spirv_cross::SmallVector<spirv_cross::CombinedImageSampler,_8UL>::SmallVector
            ((SmallVector<spirv_cross::CombinedImageSampler,_8UL> *)local_a0,other);
  spirv_cross::SmallVector<spvc_combined_image_sampler,_8UL>::SmallVector
            ((SmallVector<spvc_combined_image_sampler,_8UL> *)&__range1);
  sVar2 = spirv_cross::VectorView<spirv_cross::CombinedImageSampler>::size
                    ((VectorView<spirv_cross::CombinedImageSampler> *)local_a0);
  spirv_cross::SmallVector<spvc_combined_image_sampler,_8UL>::reserve
            ((SmallVector<spvc_combined_image_sampler,_8UL> *)&__range1,sVar2);
  __end1 = spirv_cross::VectorView<spirv_cross::CombinedImageSampler>::begin
                     ((VectorView<spirv_cross::CombinedImageSampler> *)local_a0);
  pCVar3 = spirv_cross::VectorView<spirv_cross::CombinedImageSampler>::end
                     ((VectorView<spirv_cross::CombinedImageSampler> *)local_a0);
  for (; __end1 != pCVar3; __end1 = __end1 + 1) {
    ptr._M_t.
    super___uniq_ptr_impl<TemporaryBuffer<spvc_combined_image_sampler>,_std::default_delete<TemporaryBuffer<spvc_combined_image_sampler>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_TemporaryBuffer<spvc_combined_image_sampler>_*,_std::default_delete<TemporaryBuffer<spvc_combined_image_sampler>_>_>
    .super__Head_base<0UL,_TemporaryBuffer<spvc_combined_image_sampler>_*,_false>._M_head_impl._4_4_
         = spirv_cross::TypedID::operator_cast_to_unsigned_int((TypedID *)__end1);
    spirv_cross::TypedID::operator_cast_to_unsigned_int((TypedID *)&__end1->image_id);
    spirv_cross::TypedID::operator_cast_to_unsigned_int((TypedID *)&__end1->sampler_id);
    spirv_cross::SmallVector<spvc_combined_image_sampler,_8UL>::push_back
              ((SmallVector<spvc_combined_image_sampler,_8UL> *)&__range1,
               (spvc_combined_image_sampler *)
               ((long)&ptr._M_t.
                       super___uniq_ptr_impl<TemporaryBuffer<spvc_combined_image_sampler>,_std::default_delete<TemporaryBuffer<spvc_combined_image_sampler>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_TemporaryBuffer<spvc_combined_image_sampler>_*,_std::default_delete<TemporaryBuffer<spvc_combined_image_sampler>_>_>
                       .super__Head_base<0UL,_TemporaryBuffer<spvc_combined_image_sampler>_*,_false>
                       ._M_head_impl + 4));
  }
  spvc_allocate<TemporaryBuffer<spvc_combined_image_sampler>>();
  pTVar4 = std::
           unique_ptr<TemporaryBuffer<spvc_combined_image_sampler>,_std::default_delete<TemporaryBuffer<spvc_combined_image_sampler>_>_>
           ::operator->(&local_160);
  spirv_cross::SmallVector<spvc_combined_image_sampler,_8UL>::operator=
            (&pTVar4->buffer,(SmallVector<spvc_combined_image_sampler,_8UL> *)&__range1);
  pTVar4 = std::
           unique_ptr<TemporaryBuffer<spvc_combined_image_sampler>,_std::default_delete<TemporaryBuffer<spvc_combined_image_sampler>_>_>
           ::operator->(&local_160);
  psVar5 = spirv_cross::VectorView<spvc_combined_image_sampler>::data
                     (&(pTVar4->buffer).super_VectorView<spvc_combined_image_sampler>);
  *samplers = psVar5;
  pTVar4 = std::
           unique_ptr<TemporaryBuffer<spvc_combined_image_sampler>,_std::default_delete<TemporaryBuffer<spvc_combined_image_sampler>_>_>
           ::operator->(&local_160);
  sVar2 = spirv_cross::VectorView<spvc_combined_image_sampler>::size
                    (&(pTVar4->buffer).super_VectorView<spvc_combined_image_sampler>);
  *(size_t *)combined.stack_storage.aligned_char._88_8_ = sVar2;
  psVar1 = compiler->context;
  std::unique_ptr<ScratchMemoryAllocation,std::default_delete<ScratchMemoryAllocation>>::
  unique_ptr<TemporaryBuffer<spvc_combined_image_sampler>,std::default_delete<TemporaryBuffer<spvc_combined_image_sampler>>,void>
            ((unique_ptr<ScratchMemoryAllocation,std::default_delete<ScratchMemoryAllocation>> *)&e,
             &local_160);
  spirv_cross::
  SmallVector<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>,_8UL>
  ::push_back(&psVar1->allocations,
              (unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_> *)
              &e);
  std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>::
  ~unique_ptr((unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_> *)
              &e);
  std::
  unique_ptr<TemporaryBuffer<spvc_combined_image_sampler>,_std::default_delete<TemporaryBuffer<spvc_combined_image_sampler>_>_>
  ::~unique_ptr(&local_160);
  spirv_cross::SmallVector<spvc_combined_image_sampler,_8UL>::~SmallVector
            ((SmallVector<spvc_combined_image_sampler,_8UL> *)&__range1);
  spirv_cross::SmallVector<spirv_cross::CombinedImageSampler,_8UL>::~SmallVector
            ((SmallVector<spirv_cross::CombinedImageSampler,_8UL> *)local_a0);
  return SPVC_SUCCESS;
}

Assistant:

spvc_result spvc_compiler_get_combined_image_samplers(spvc_compiler compiler,
                                                      const spvc_combined_image_sampler **samplers,
                                                      size_t *num_samplers)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		auto combined = compiler->compiler->get_combined_image_samplers();
		SmallVector<spvc_combined_image_sampler> translated;
		translated.reserve(combined.size());
		for (auto &c : combined)
		{
			spvc_combined_image_sampler trans = { c.combined_id, c.image_id, c.sampler_id };
			translated.push_back(trans);
		}

		auto ptr = spvc_allocate<TemporaryBuffer<spvc_combined_image_sampler>>();
		ptr->buffer = std::move(translated);
		*samplers = ptr->buffer.data();
		*num_samplers = ptr->buffer.size();
		compiler->context->allocations.push_back(std::move(ptr));
	}